

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.cpp
# Opt level: O0

QNativeIpcKey * QtIpcCommon::legacyPlatformSafeKey(QString *key,IpcType ipcType,Type type)

{
  long lVar1;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView str;
  QByteArrayView data;
  bool bVar2;
  const_iterator pQVar3;
  short in_CX;
  IpcType in_EDX;
  QString *in_RSI;
  QNativeIpcKey *in_RDI;
  long in_FS_OFFSET;
  const_iterator __end1;
  const_iterator __begin1;
  QString *__range1;
  QNativeIpcKey *k;
  QChar ch;
  QString result;
  QByteArray hex;
  undefined6 in_stack_fffffffffffffe18;
  Type in_stack_fffffffffffffe1e;
  QNativeIpcKey *in_stack_fffffffffffffe20;
  QStringBuilder<QString,_char16_t> *in_stack_fffffffffffffe28;
  QLatin1String *in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe39;
  undefined1 in_stack_fffffffffffffe3a;
  undefined1 in_stack_fffffffffffffe3b;
  undefined2 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  undefined8 in_stack_fffffffffffffe40;
  Algorithm method;
  qsizetype in_stack_fffffffffffffe48;
  const_iterator local_188;
  undefined7 in_stack_fffffffffffffe80;
  char in_stack_fffffffffffffe87;
  QByteArray *in_stack_fffffffffffffe88;
  QChar local_ea [11];
  char16_t local_d4;
  QChar local_d2;
  QChar local_d0;
  QChar local_ce;
  QChar local_cc;
  char16_t local_ca;
  undefined1 *local_c8;
  undefined1 *puVar4;
  StandardLocation type_00;
  
  method = (Algorithm)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDI,0xaa,0x28);
  QNativeIpcKey::QNativeIpcKey(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1e);
  bVar2 = QString::isEmpty((QString *)0x267541);
  if (bVar2) goto LAB_00267c27;
  QString::toUtf8((QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18));
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)in_stack_fffffffffffffe30,(QByteArray *)in_stack_fffffffffffffe28);
  data.m_size._7_1_ = in_stack_fffffffffffffe87;
  data.m_size._0_7_ = in_stack_fffffffffffffe80;
  data.m_data = (storage_type *)in_stack_fffffffffffffe88;
  QCryptographicHash::hash(data,method);
  QByteArray::toHex(in_stack_fffffffffffffe88,in_stack_fffffffffffffe87);
  QByteArray::~QByteArray((QByteArray *)0x2675f6);
  QByteArray::~QByteArray((QByteArray *)0x267603);
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puVar4 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2676b2);
  QString::size(in_RSI);
  QString::reserve((QString *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe48);
  if (in_EDX == SharedMemory) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
    s.m_data._0_1_ = in_stack_fffffffffffffe38;
    s.m_size = (qsizetype)in_stack_fffffffffffffe30;
    s.m_data._1_1_ = in_stack_fffffffffffffe39;
    s.m_data._2_1_ = in_stack_fffffffffffffe3a;
    s.m_data._3_1_ = in_stack_fffffffffffffe3b;
    s.m_data._4_2_ = in_stack_fffffffffffffe3c;
    s.m_data._6_1_ = in_stack_fffffffffffffe3e;
    s.m_data._7_1_ = in_stack_fffffffffffffe3f;
    QString::operator+=((QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18),s);
  }
  else if (in_EDX == SystemSemaphore) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
    s_00.m_data._0_1_ = in_stack_fffffffffffffe38;
    s_00.m_size = (qsizetype)in_stack_fffffffffffffe30;
    s_00.m_data._1_1_ = in_stack_fffffffffffffe39;
    s_00.m_data._2_1_ = in_stack_fffffffffffffe3a;
    s_00.m_data._3_1_ = in_stack_fffffffffffffe3b;
    s_00.m_data._4_2_ = in_stack_fffffffffffffe3c;
    s_00.m_data._6_1_ = in_stack_fffffffffffffe3e;
    s_00.m_data._7_1_ = in_stack_fffffffffffffe3f;
    QString::operator+=((QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18),
                        s_00);
  }
  local_188 = QString::begin((QString *)0x2677ac);
  pQVar3 = QString::end((QString *)in_stack_fffffffffffffe20);
  for (; type_00 = (StandardLocation)((ulong)puVar4 >> 0x20), local_188 != pQVar3;
      local_188 = local_188 + 1) {
    local_ca = local_188->ucs;
    QChar::QChar<char16_t,_true>(&local_cc,L'a');
    bVar2 = operator>=((QChar *)in_stack_fffffffffffffe20,
                       (QChar *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18));
    if (bVar2) {
      QChar::QChar<char16_t,_true>(&local_ce,L'z');
      bVar2 = operator<=((QChar *)in_stack_fffffffffffffe20,
                         (QChar *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18));
      in_stack_fffffffffffffe3f = true;
      if (!bVar2) goto LAB_00267868;
    }
    else {
LAB_00267868:
      QChar::QChar<char16_t,_true>(&local_d0,L'A');
      bVar2 = operator>=((QChar *)in_stack_fffffffffffffe20,
                         (QChar *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18));
      in_stack_fffffffffffffe3e = false;
      in_stack_fffffffffffffe3f = in_stack_fffffffffffffe3e;
      if (bVar2) {
        QChar::QChar<char16_t,_true>(&local_d2,L'Z');
        in_stack_fffffffffffffe3e =
             operator<=((QChar *)in_stack_fffffffffffffe20,
                        (QChar *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18));
        in_stack_fffffffffffffe3f = in_stack_fffffffffffffe3e;
      }
    }
    if ((bool)in_stack_fffffffffffffe3f != false) {
      local_d4 = local_ca;
      QString::operator+=((QString *)in_stack_fffffffffffffe20,
                          (QChar)(char16_t)((ulong)in_stack_fffffffffffffe28 >> 0x30));
    }
  }
  QLatin1String::QLatin1String(in_stack_fffffffffffffe30,(QByteArray *)in_stack_fffffffffffffe28);
  str.m_data._0_1_ = in_stack_fffffffffffffe38;
  str.m_size = (qsizetype)in_stack_fffffffffffffe30;
  str.m_data._1_1_ = in_stack_fffffffffffffe39;
  str.m_data._2_1_ = in_stack_fffffffffffffe3a;
  str.m_data._3_1_ = in_stack_fffffffffffffe3b;
  str.m_data._4_2_ = in_stack_fffffffffffffe3c;
  str.m_data._6_1_ = in_stack_fffffffffffffe3e;
  str.m_data._7_1_ = in_stack_fffffffffffffe3f;
  QString::append((QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18),str);
  if (in_CX == 0x51) {
LAB_00267a65:
    bVar2 = isIpcSupported(in_EDX,SystemV);
    if (bVar2) {
      QStandardPaths::writableLocation(type_00);
      ::operator+(&in_stack_fffffffffffffe28->a,(char16_t *)in_stack_fffffffffffffe20);
      ::operator+(in_stack_fffffffffffffe28,(QString *)in_stack_fffffffffffffe20);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> *)
                 CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18));
      QString::operator=((QString *)in_stack_fffffffffffffe20,
                         (QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18));
      QString::~QString((QString *)0x267b25);
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> *)0x267b32);
      QStringBuilder<QString,_char16_t>::~QStringBuilder
                ((QStringBuilder<QString,_char16_t> *)0x267b3f);
      QString::~QString((QString *)0x267b4c);
      QNativeIpcKeyPrivate::setNativeAndLegacyKeys
                (in_stack_fffffffffffffe20,
                 (QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18),
                 (QString *)0x267b63);
    }
  }
  else if (in_CX == 0x100) {
    QChar::QChar<char16_t,_true>(local_ea,L'/');
    QString::prepend((QString *)in_stack_fffffffffffffe20,
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffffe28 >> 0x30));
    bVar2 = isIpcSupported(in_EDX,PosixRealtime);
    if (bVar2) {
      QNativeIpcKeyPrivate::setNativeAndLegacyKeys
                (in_stack_fffffffffffffe20,
                 (QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18),
                 (QString *)0x267a47);
    }
  }
  else {
    if (in_CX != 0x101) goto LAB_00267a65;
    bVar2 = isIpcSupported(in_EDX,Windows);
    if (bVar2) {
      QNativeIpcKeyPrivate::setNativeAndLegacyKeys
                (in_stack_fffffffffffffe20,
                 (QString *)CONCAT26(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18),
                 (QString *)0x2679c7);
    }
  }
  QString::~QString((QString *)0x267bfc);
  QByteArray::~QByteArray((QByteArray *)0x267c09);
LAB_00267c27:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QNativeIpcKey QtIpcCommon::legacyPlatformSafeKey(const QString &key, QtIpcCommon::IpcType ipcType,
                                                 QNativeIpcKey::Type type)
{
    QNativeIpcKey k(type);
    if (key.isEmpty())
        return k;

    QByteArray hex = QCryptographicHash::hash(key.toUtf8(), QCryptographicHash::Sha1).toHex();

    if (type == QNativeIpcKey::Type::PosixRealtime) {
#if defined(Q_OS_DARWIN)
        if (qt_apple_isSandboxed()) {
            // Sandboxed applications on Apple platforms require the shared memory name
            // to be in the form <application group identifier>/<custom identifier>.
            // Since we don't know which application group identifier the user wants
            // to apply, we instead document that requirement, and use the key directly.
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, key, key);
        } else {
            // The shared memory name limit on Apple platforms is very low (30 characters),
            // so we can't use the logic below of combining the prefix, key, and a hash,
            // to ensure a unique and valid name. Instead we use the first part of the
            // hash, which should still long enough to avoid collisions in practice.
            QString native = u'/' + QLatin1StringView(hex).left(SHM_NAME_MAX - 1);
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, native, key);
        }
        return k;
#endif
    }

    QString result;
    result.reserve(1 + 18 + key.size() + 40);
    switch (ipcType) {
    case IpcType::SharedMemory:
        result += "qipc_sharedmemory_"_L1;
        break;
    case IpcType::SystemSemaphore:
        result += "qipc_systemsem_"_L1;
        break;
    }

    for (QChar ch : key) {
        if ((ch >= u'a' && ch <= u'z') ||
           (ch >= u'A' && ch <= u'Z'))
           result += ch;
    }
    result.append(QLatin1StringView(hex));

    switch (type) {
    case QNativeIpcKey::Type::Windows:
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::Windows))
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
        return k;
    case QNativeIpcKey::Type::PosixRealtime:
        result.prepend(u'/');
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::PosixRealtime))
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
        return k;
    case QNativeIpcKey::Type::SystemV:
        break;
    }
    if (isIpcSupported(ipcType, QNativeIpcKey::Type::SystemV)) {
        result = QStandardPaths::writableLocation(QStandardPaths::TempLocation) + u'/' + result;
        QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
    }
    return k;
}